

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

exr_result_t
exr_encoding_choose_default_routines
          (exr_const_context_t ctxt,int part_index,exr_encode_pipeline_t *encode)

{
  long lVar1;
  exr_result_t eVar2;
  internal_exr_pack_fn p_Var3;
  
  if (ctxt == (exr_const_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar2 = (**(code **)(ctxt + 0x48))
                        (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
      return eVar2;
    }
    if (encode == (exr_encode_pipeline_t *)0x0) {
      eVar2 = (**(code **)(ctxt + 0x38))(ctxt,3);
      return eVar2;
    }
    if ((encode->context != ctxt) || (encode->part_index != part_index)) {
      eVar2 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,
                         "Cross-wired request for default routines from different context / part",
                         *(code **)(ctxt + 0x48));
      return eVar2;
    }
    lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
    p_Var3 = internal_exr_match_encode(encode,(uint)((*(uint *)(lVar1 + 4) & 0xfffffffe) == 2));
    encode->convert_and_pack_fn = (_func_exr_result_t__exr_encode_pipeline_ptr *)p_Var3;
    if (*(int *)(lVar1 + 0xb0) != 0) {
      encode->compress_fn = default_compress_chunk;
    }
    encode->yield_until_ready_fn = default_yield;
    encode->write_fn = default_write_chunk;
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_encoding_choose_default_routines (
    exr_const_context_t ctxt, int part_index, exr_encode_pipeline_t* encode)
{
    int32_t isdeep = 0;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!encode)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (encode->context != ctxt || encode->part_index != part_index)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Cross-wired request for default routines from different context / part"));

    isdeep = (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
              part->storage_mode == EXR_STORAGE_DEEP_TILED)
                 ? 1
                 : 0;

    encode->convert_and_pack_fn = internal_exr_match_encode (encode, isdeep);
    if (part->comp_type != EXR_COMPRESSION_NONE)
        encode->compress_fn = &default_compress_chunk;
    encode->yield_until_ready_fn = &default_yield;
    encode->write_fn             = &default_write_chunk;

    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
}